

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

QTreeWidgetItem * __thiscall QTreeWidget::currentItem(QTreeWidget *this)

{
  QTreeWidgetItem *pQVar1;
  long in_FS_OFFSET;
  QModelIndex local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::currentIndex(&local_30,(QAbstractItemView *)this);
  QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
  if ((QTreeWidgetItem *)local_30.m.ptr != (QTreeWidgetItem *)0x0) {
    local_30.m.ptr = (QAbstractItemModel *)local_30.i;
  }
  pQVar1 = (QTreeWidgetItem *)0x0;
  if (-1 < (local_30.c | local_30.r)) {
    pQVar1 = (QTreeWidgetItem *)local_30.m.ptr;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem *QTreeWidget::currentItem() const
{
    Q_D(const QTreeWidget);
    return d->item(currentIndex());
}